

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSFFile.cpp
# Opt level: O1

void __thiscall PSFFile::PSFFile(PSFFile *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_PSFFile = (_func_int **)&PTR__PSFFile_00109d20;
  (this->reserved).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reserved).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reserved).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ZlibReader::ZlibReader(&this->compressed_exe);
  p_Var1 = &(this->tags)._M_t._M_impl.super__Rb_tree_header;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

PSFFile::PSFFile()
{
}